

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_blake256.c
# Opt level: O1

void hmac_blake224_init(hmac_state *S,uint8_t *_key,uint64_t keylen)

{
  uint64_t uVar1;
  uint8_t *out;
  uint8_t pad [64];
  uint8_t keyhash [32];
  byte local_88 [64];
  uint8_t local_48 [40];
  
  out = _key;
  if (0x40 < keylen) {
    out = local_48;
    blake256_hash(out,_key,keylen);
    keylen = 0x1c;
  }
  (S->inner).h[0] = 0xc1059ed8;
  (S->inner).h[1] = 0x367cd507;
  (S->inner).h[2] = 0x3070dd17;
  (S->inner).h[3] = 0xf70e5939;
  (S->inner).h[4] = 0xffc00b31;
  (S->inner).h[5] = 0x68581511;
  (S->inner).h[6] = 0x64f98fa7;
  (S->inner).h[7] = 0xbefa4fa4;
  (S->inner).s[0] = 0;
  (S->inner).s[1] = 0;
  (S->inner).s[2] = 0;
  (S->inner).s[3] = 0;
  (S->inner).t[0] = 0;
  (S->inner).t[1] = 0;
  (S->inner).buflen = 0;
  (S->inner).nullt = 0;
  local_88[0x30] = 0x36;
  local_88[0x31] = 0x36;
  local_88[0x32] = 0x36;
  local_88[0x33] = 0x36;
  local_88[0x34] = 0x36;
  local_88[0x35] = 0x36;
  local_88[0x36] = 0x36;
  local_88[0x37] = 0x36;
  local_88[0x38] = 0x36;
  local_88[0x39] = 0x36;
  local_88[0x3a] = 0x36;
  local_88[0x3b] = 0x36;
  local_88[0x3c] = 0x36;
  local_88[0x3d] = 0x36;
  local_88[0x3e] = 0x36;
  local_88[0x3f] = 0x36;
  local_88[0x20] = 0x36;
  local_88[0x21] = 0x36;
  local_88[0x22] = 0x36;
  local_88[0x23] = 0x36;
  local_88[0x24] = 0x36;
  local_88[0x25] = 0x36;
  local_88[0x26] = 0x36;
  local_88[0x27] = 0x36;
  local_88[0x28] = 0x36;
  local_88[0x29] = 0x36;
  local_88[0x2a] = 0x36;
  local_88[0x2b] = 0x36;
  local_88[0x2c] = 0x36;
  local_88[0x2d] = 0x36;
  local_88[0x2e] = 0x36;
  local_88[0x2f] = 0x36;
  local_88[0x10] = 0x36;
  local_88[0x11] = 0x36;
  local_88[0x12] = 0x36;
  local_88[0x13] = 0x36;
  local_88[0x14] = 0x36;
  local_88[0x15] = 0x36;
  local_88[0x16] = 0x36;
  local_88[0x17] = 0x36;
  local_88[0x18] = 0x36;
  local_88[0x19] = 0x36;
  local_88[0x1a] = 0x36;
  local_88[0x1b] = 0x36;
  local_88[0x1c] = 0x36;
  local_88[0x1d] = 0x36;
  local_88[0x1e] = 0x36;
  local_88[0x1f] = 0x36;
  local_88[0] = 0x36;
  local_88[1] = 0x36;
  local_88[2] = 0x36;
  local_88[3] = 0x36;
  local_88[4] = 0x36;
  local_88[5] = 0x36;
  local_88[6] = 0x36;
  local_88[7] = 0x36;
  local_88[8] = 0x36;
  local_88[9] = 0x36;
  local_88[10] = 0x36;
  local_88[0xb] = 0x36;
  local_88[0xc] = 0x36;
  local_88[0xd] = 0x36;
  local_88[0xe] = 0x36;
  local_88[0xf] = 0x36;
  if (keylen != 0) {
    uVar1 = 0;
    do {
      local_88[uVar1] = local_88[uVar1] ^ out[uVar1];
      uVar1 = uVar1 + 1;
    } while (keylen != uVar1);
  }
  blake256_update(&S->inner,local_88,0x200);
  (S->outer).h[0] = 0xc1059ed8;
  (S->outer).h[1] = 0x367cd507;
  (S->outer).h[2] = 0x3070dd17;
  (S->outer).h[3] = 0xf70e5939;
  (S->outer).h[4] = 0xffc00b31;
  (S->outer).h[5] = 0x68581511;
  (S->outer).h[6] = 0x64f98fa7;
  (S->outer).h[7] = 0xbefa4fa4;
  (S->outer).s[0] = 0;
  (S->outer).s[1] = 0;
  (S->outer).s[2] = 0;
  (S->outer).s[3] = 0;
  (S->outer).t[0] = 0;
  (S->outer).t[1] = 0;
  (S->outer).buflen = 0;
  (S->outer).nullt = 0;
  local_88[0x30] = 0x5c;
  local_88[0x31] = 0x5c;
  local_88[0x32] = 0x5c;
  local_88[0x33] = 0x5c;
  local_88[0x34] = 0x5c;
  local_88[0x35] = 0x5c;
  local_88[0x36] = 0x5c;
  local_88[0x37] = 0x5c;
  local_88[0x38] = 0x5c;
  local_88[0x39] = 0x5c;
  local_88[0x3a] = 0x5c;
  local_88[0x3b] = 0x5c;
  local_88[0x3c] = 0x5c;
  local_88[0x3d] = 0x5c;
  local_88[0x3e] = 0x5c;
  local_88[0x3f] = 0x5c;
  local_88[0x20] = 0x5c;
  local_88[0x21] = 0x5c;
  local_88[0x22] = 0x5c;
  local_88[0x23] = 0x5c;
  local_88[0x24] = 0x5c;
  local_88[0x25] = 0x5c;
  local_88[0x26] = 0x5c;
  local_88[0x27] = 0x5c;
  local_88[0x28] = 0x5c;
  local_88[0x29] = 0x5c;
  local_88[0x2a] = 0x5c;
  local_88[0x2b] = 0x5c;
  local_88[0x2c] = 0x5c;
  local_88[0x2d] = 0x5c;
  local_88[0x2e] = 0x5c;
  local_88[0x2f] = 0x5c;
  local_88[0x10] = 0x5c;
  local_88[0x11] = 0x5c;
  local_88[0x12] = 0x5c;
  local_88[0x13] = 0x5c;
  local_88[0x14] = 0x5c;
  local_88[0x15] = 0x5c;
  local_88[0x16] = 0x5c;
  local_88[0x17] = 0x5c;
  local_88[0x18] = 0x5c;
  local_88[0x19] = 0x5c;
  local_88[0x1a] = 0x5c;
  local_88[0x1b] = 0x5c;
  local_88[0x1c] = 0x5c;
  local_88[0x1d] = 0x5c;
  local_88[0x1e] = 0x5c;
  local_88[0x1f] = 0x5c;
  local_88[0] = 0x5c;
  local_88[1] = 0x5c;
  local_88[2] = 0x5c;
  local_88[3] = 0x5c;
  local_88[4] = 0x5c;
  local_88[5] = 0x5c;
  local_88[6] = 0x5c;
  local_88[7] = 0x5c;
  local_88[8] = 0x5c;
  local_88[9] = 0x5c;
  local_88[10] = 0x5c;
  local_88[0xb] = 0x5c;
  local_88[0xc] = 0x5c;
  local_88[0xd] = 0x5c;
  local_88[0xe] = 0x5c;
  local_88[0xf] = 0x5c;
  if (keylen != 0) {
    uVar1 = 0;
    do {
      local_88[uVar1] = local_88[uVar1] ^ out[uVar1];
      uVar1 = uVar1 + 1;
    } while (keylen != uVar1);
  }
  blake256_update(&S->outer,local_88,0x200);
  return;
}

Assistant:

void hmac_blake224_init(hmac_state *S, const uint8_t *_key, uint64_t keylen) {
    const uint8_t *key = _key;
    uint8_t keyhash[32];
    uint8_t pad[64];
    uint64_t i;

    if (keylen > 64) {
        blake256_hash(keyhash, key, keylen);
        key = keyhash;
        keylen = 28;
    }

    blake224_init(&S->inner);
    memset(pad, 0x36, 64);
    for (i = 0; i < keylen; ++i) {
        pad[i] ^= key[i];
    }
    blake224_update(&S->inner, pad, 512);

    blake224_init(&S->outer);
    memset(pad, 0x5c, 64);
    for (i = 0; i < keylen; ++i) {
        pad[i] ^= key[i];
    }
    blake224_update(&S->outer, pad, 512);

    memset(keyhash, 0, 32);
}